

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

void ircode_set_index(uint32_t index,ircode_t *code,opcode_t op,uint32_t p1,uint32_t p2,uint32_t p3)

{
  inst_t *piVar1;
  inst_t *inst;
  uint32_t p3_local;
  uint32_t p2_local;
  uint32_t p1_local;
  opcode_t op_local;
  ircode_t *code_local;
  uint32_t index_local;
  
  piVar1 = code->list->p[index];
  piVar1->op = op;
  piVar1->p1 = p1;
  piVar1->p2 = p2;
  piVar1->p3 = p3;
  piVar1->tag = NO_TAG;
  return;
}

Assistant:

void ircode_set_index (uint32_t index, ircode_t *code, opcode_t op, uint32_t p1, uint32_t p2, uint32_t p3) {
    inst_t *inst = marray_get(*code->list, index);
    inst->op = op;
    inst->p1 = p1;
    inst->p2 = p2;
    inst->p3 = p3;
    inst->tag = NO_TAG;
}